

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

uint32_t __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::GenChunkMask
          (anon_unknown_0 *this,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields,vector<int,_std::allocator<int>_> *has_bit_indices)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  pointer piVar4;
  void *pvVar5;
  void *pvVar6;
  uint uVar7;
  uint32_t uVar8;
  uint32_t extraout_EAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar9;
  int iVar10;
  long *plVar11;
  void *pvVar12;
  _GLOBAL__N_1 *this_00;
  uint uVar13;
  _GLOBAL__N_1 local_10 [16];
  undefined8 extraout_RAX;
  
  if (this != (anon_unknown_0 *)fields) {
    lVar3 = *(long *)this;
    if ((*(byte *)(lVar3 + 1) & 8) == 0) {
      plVar11 = (long *)(*(long *)(lVar3 + 0x20) + 0x38);
    }
    else if (*(long *)(lVar3 + 0x28) == 0) {
      plVar11 = (long *)(*(long *)(lVar3 + 0x10) + 0x78);
    }
    else {
      plVar11 = (long *)(*(long *)(lVar3 + 0x28) + 0x60);
    }
    piVar4 = (has_bit_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar4[(int)((ulong)(lVar3 - *plVar11) >> 3) * -0x45d1745d];
    iVar10 = iVar1 + 0x1f;
    if (-1 < iVar1) {
      iVar10 = iVar1;
    }
    uVar7 = 0;
    while( true ) {
      lVar3 = *(long *)this;
      if ((*(byte *)(lVar3 + 1) & 8) == 0) {
        plVar11 = (long *)(*(long *)(lVar3 + 0x20) + 0x38);
      }
      else if (*(long *)(lVar3 + 0x28) == 0) {
        plVar11 = (long *)(*(long *)(lVar3 + 0x10) + 0x78);
      }
      else {
        plVar11 = (long *)(*(long *)(lVar3 + 0x28) + 0x60);
      }
      uVar2 = piVar4[(int)((ulong)(lVar3 - *plVar11) >> 3) * -0x45d1745d];
      uVar13 = uVar2 + 0x1f;
      if (-1 < (int)uVar2) {
        uVar13 = uVar2;
      }
      if (iVar10 >> 5 != (int)uVar13 >> 5) break;
      uVar7 = uVar7 | 1 << (uVar2 & 0x1f);
      this = this + 8;
      if (this == (anon_unknown_0 *)fields) {
        return uVar7;
      }
    }
    _GLOBAL__N_1::GenChunkMask();
  }
  this_00 = local_10;
  _GLOBAL__N_1::GenChunkMask(this_00);
  uVar8 = (uint32_t)extraout_RAX;
  pvVar12 = *(void **)this_00;
  pvVar5 = *(void **)(this_00 + 8);
  uVar9 = extraout_RAX;
  if (pvVar12 != pvVar5) {
    do {
      pvVar6 = *(void **)((long)pvVar12 + 8);
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6,*(long *)((long)pvVar12 + 0x18) - (long)pvVar6);
        uVar9 = extraout_RAX_00;
      }
      uVar8 = (uint32_t)uVar9;
      pvVar12 = (void *)((long)pvVar12 + 0x20);
    } while (pvVar12 != pvVar5);
    pvVar12 = *(void **)this_00;
  }
  if (pvVar12 != (void *)0x0) {
    operator_delete(pvVar12,*(long *)(this_00 + 0x10) - (long)pvVar12);
    return extraout_EAX;
  }
  return uVar8;
}

Assistant:

uint32_t GenChunkMask(const std::vector<const FieldDescriptor*>& fields,
                      const std::vector<int>& has_bit_indices) {
  ABSL_CHECK(!fields.empty());
  int first_index_offset = has_bit_indices[fields.front()->index()] / 32;
  uint32_t chunk_mask = 0;
  for (auto field : fields) {
    // "index" defines where in the _has_bits_ the field appears.
    int index = has_bit_indices[field->index()];
    ABSL_CHECK_EQ(first_index_offset, index / 32);
    chunk_mask |= static_cast<uint32_t>(1) << (index % 32);
  }
  ABSL_CHECK_NE(0u, chunk_mask);
  return chunk_mask;
}